

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeInteger.c
# Opt level: O2

asn_dec_rval_t
NativeInteger_decode_ber
          (asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **nint_ptr,void *buf_ptr,
          size_t size,int tag_mode)

{
  undefined1 auVar1 [16];
  int iVar2;
  long *plVar3;
  size_t sVar4;
  asn_dec_rval_t aVar5;
  long l;
  ber_tlv_len_t length;
  void *local_48;
  INTEGER_t tmp;
  
  local_48 = td->specifics;
  plVar3 = (long *)*nint_ptr;
  if (plVar3 == (long *)0x0) {
    plVar3 = (long *)calloc(1,8);
    *nint_ptr = plVar3;
    if (plVar3 == (long *)0x0) goto LAB_001410db;
  }
  aVar5 = ber_check_tags(opt_codec_ctx,td,(asn_struct_ctx_t *)0x0,buf_ptr,size,tag_mode,0,&length,
                         (int *)0x0);
  sVar4 = aVar5.consumed;
  if (aVar5.code != RC_OK) {
    return aVar5;
  }
  if ((long)(size - sVar4) < length) {
    return (asn_dec_rval_t)ZEXT816(1);
  }
  tmp.buf = (uint8_t *)((long)buf_ptr + sVar4);
  tmp.size = (int)length;
  if ((local_48 == (void *)0x0) || (*(int *)((long)local_48 + 0x20) == 0)) {
    iVar2 = asn_INTEGER2long(&tmp,&l);
  }
  else {
    iVar2 = asn_INTEGER2ulong(&tmp,(unsigned_long *)&l);
  }
  if (iVar2 == 0) {
    *plVar3 = l;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar4 + length;
    return (asn_dec_rval_t)(auVar1 << 0x40);
  }
LAB_001410db:
  return (asn_dec_rval_t)ZEXT816(2);
}

Assistant:

asn_dec_rval_t
NativeInteger_decode_ber(asn_codec_ctx_t *opt_codec_ctx,
	asn_TYPE_descriptor_t *td,
	void **nint_ptr, const void *buf_ptr, size_t size, int tag_mode) {
	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
	long *native = (long *)*nint_ptr;
	asn_dec_rval_t rval;
	ber_tlv_len_t length;

	/*
	 * If the structure is not there, allocate it.
	 */
	if(native == NULL) {
		native = (long *)(*nint_ptr = CALLOC(1, sizeof(*native)));
		if(native == NULL) {
			rval.code = RC_FAIL;
			rval.consumed = 0;
			return rval;
		}
	}

	ASN_DEBUG("Decoding %s as INTEGER (tm=%d)",
		td->name, tag_mode);

	/*
	 * Check tags.
	 */
	rval = ber_check_tags(opt_codec_ctx, td, 0, buf_ptr, size,
			tag_mode, 0, &length, 0);
	if(rval.code != RC_OK)
		return rval;

	ASN_DEBUG("%s length is %d bytes", td->name, (int)length);

	/*
	 * Make sure we have this length.
	 */
	buf_ptr = ((const char *)buf_ptr) + rval.consumed;
	size -= rval.consumed;
	if(length > (ber_tlv_len_t)size) {
		rval.code = RC_WMORE;
		rval.consumed = 0;
		return rval;
	}

	/*
	 * ASN.1 encoded INTEGER: buf_ptr, length
	 * Fill the native, at the same time checking for overflow.
	 * If overflow occured, return with RC_FAIL.
	 */
	{
		INTEGER_t tmp;
		union {
			const void *constbuf;
			void *nonconstbuf;
		} unconst_buf;
		long l;

		unconst_buf.constbuf = buf_ptr;
		tmp.buf = (uint8_t *)unconst_buf.nonconstbuf;
		tmp.size = length;

		if((specs&&specs->field_unsigned)
			? asn_INTEGER2ulong(&tmp, (unsigned long *)&l) /* sic */
			: asn_INTEGER2long(&tmp, &l)) {
			rval.code = RC_FAIL;
			rval.consumed = 0;
			return rval;
		}

		*native = l;
	}

	rval.code = RC_OK;
	rval.consumed += length;

	ASN_DEBUG("Took %ld/%ld bytes to encode %s (%ld)",
		(long)rval.consumed, (long)length, td->name, (long)*native);

	return rval;
}